

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O2

int wally_elements_pegout_script_from_bytes
              (uchar *genesis_blockhash,size_t genesis_blockhash_len,uchar *mainchain_script,
              size_t mainchain_script_len,uchar *sub_pubkey,size_t sub_pubkey_len,
              uchar *whitelistproof,size_t whitelistproof_len,uint32_t flags,uchar *bytes_out,
              size_t len,size_t *written)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong len_00;
  uchar *puVar4;
  undefined1 auVar5 [16];
  size_t bytes_written;
  
  bytes_written = 1;
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  auVar5._0_4_ = -(uint)(genesis_blockhash == (uchar *)0x0);
  auVar5._4_4_ = -(uint)(mainchain_script == (uchar *)0x0);
  auVar5._8_4_ = -(uint)(sub_pubkey == (uchar *)0x0);
  auVar5._12_4_ = -(uint)(whitelistproof == (uchar *)0x0);
  iVar2 = movmskps((int)mainchain_script_len,auVar5);
  iVar1 = -2;
  if (((((iVar2 == 0) && (genesis_blockhash_len == 0x20)) && (mainchain_script_len != 0)) &&
      ((sub_pubkey_len == 0x21 && (whitelistproof_len != 0)))) &&
     ((len != 0 && ((bytes_out != (uchar *)0x0 && (flags == 0)))))) {
    *bytes_out = 'j';
    if (written != (size_t *)0x0) {
      *written = *written + 1;
    }
    puVar4 = bytes_out + 1;
    uVar3 = len - 1;
    iVar1 = wally_script_push_from_bytes(genesis_blockhash,0x20,0,puVar4,uVar3,&bytes_written);
    if (iVar1 == 0) {
      if (written != (size_t *)0x0) {
        *written = *written + bytes_written;
      }
      len_00 = uVar3 - bytes_written;
      if (bytes_written <= uVar3) {
        puVar4 = puVar4 + bytes_written;
        iVar1 = wally_script_push_from_bytes
                          (mainchain_script,mainchain_script_len,0,puVar4,len_00,&bytes_written);
        if (iVar1 != 0) {
          return iVar1;
        }
        if (written != (size_t *)0x0) {
          *written = *written + bytes_written;
        }
        uVar3 = len_00 - bytes_written;
        if (bytes_written <= len_00) {
          puVar4 = puVar4 + bytes_written;
          iVar1 = wally_script_push_from_bytes(sub_pubkey,0x21,0,puVar4,uVar3,&bytes_written);
          if (iVar1 != 0) {
            return iVar1;
          }
          if (written != (size_t *)0x0) {
            *written = *written + bytes_written;
          }
          if (bytes_written <= uVar3) {
            iVar1 = wally_script_push_from_bytes
                              (whitelistproof,whitelistproof_len,0,puVar4 + bytes_written,
                               uVar3 - bytes_written,&bytes_written);
            if (written == (size_t *)0x0) {
              return iVar1;
            }
            if (iVar1 != 0) {
              return iVar1;
            }
            *written = *written + bytes_written;
          }
        }
      }
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int wally_elements_pegout_script_from_bytes(const unsigned char *genesis_blockhash,
                                            size_t genesis_blockhash_len,
                                            const unsigned char *mainchain_script,
                                            size_t mainchain_script_len,
                                            const unsigned char *sub_pubkey,
                                            size_t sub_pubkey_len,
                                            const unsigned char *whitelistproof,
                                            size_t whitelistproof_len,
                                            uint32_t flags,
                                            unsigned char *bytes_out,
                                            size_t len,
                                            size_t *written)
{
#define pegout_script_push(bytes, bytes_len) \
    if (len < bytes_written) \
        return WALLY_OK; \
    bytes_out += bytes_written; \
    len -= bytes_written; \
    if ((ret = wally_script_push_from_bytes(bytes, bytes_len, 0, bytes_out, len, &bytes_written)) != WALLY_OK) \
        return ret; \
    if (written) \
        *written += bytes_written;

    size_t bytes_written = 1; /* OP_RETURN */
    int ret;

    if (written)
        *written = 0;

    if (!genesis_blockhash || genesis_blockhash_len != SHA256_LEN ||
        !mainchain_script || !mainchain_script_len || !sub_pubkey || sub_pubkey_len != EC_PUBLIC_KEY_LEN ||
        !whitelistproof || !whitelistproof_len || flags || !bytes_out || !len)
        return WALLY_EINVAL;

    *bytes_out = OP_RETURN;
    if (written)
        *written += bytes_written;

    pegout_script_push(genesis_blockhash, genesis_blockhash_len);
    pegout_script_push(mainchain_script, mainchain_script_len);
    pegout_script_push(sub_pubkey, sub_pubkey_len);
    pegout_script_push(whitelistproof, whitelistproof_len);

    return WALLY_OK;

#undef pegout_script_push
}